

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export_ostream.hpp
# Opt level: O0

void __thiscall pstore::exchange::export_ns::ostringstream::~ostringstream(ostringstream *this)

{
  ostringstream *this_local;
  
  std::__cxx11::string::~string((string *)&this->str_);
  ostream_base::~ostream_base(&this->super_ostream_base);
  return;
}

Assistant:

~ostringstream () noexcept override = default;